

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

void __thiscall CEExecOptions::CEExecOptions(CEExecOptions *this,string *prog_name)

{
  CLOptions::CLOptions(&this->super_CLOptions);
  (this->super_CLOptions)._vptr_CLOptions = (_func_int **)&PTR__CEExecOptions_00119c08;
  (this->prog_name_)._M_dataplus._M_p = (pointer)&(this->prog_name_).field_2;
  (this->prog_name_)._M_string_length = 0;
  (this->prog_name_).field_2._M_local_buf[0] = '\0';
  init_members(this);
  SetProgName(this,prog_name);
  return;
}

Assistant:

CEExecOptions(const std::string& prog_name)
        {
            init_members();
            SetProgName(prog_name);
        }